

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.cpp
# Opt level: O2

long Random::random(void)

{
  uint uVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  random_device rd;
  random_device local_1390;
  
  if (seeded_ == '\0') {
    std::random_device::random_device(&local_1390);
    uVar1 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)gen_,(ulong)uVar1);
    seeded_ = '\x01';
    std::random_device::~random_device(&local_1390);
  }
  std::uniform_real_distribution<double>::operator()
            ((uniform_real_distribution<double> *)dis_,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)gen_);
  return CONCAT44(extraout_var,extraout_EAX);
}

Assistant:

double Random::random() {
  if (!seeded_) {
    std::random_device rd;
    gen_.seed(rd());
    seeded_ = true;
  }
  return dis_(gen_);
}